

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O0

int SetHTTPrequest(OperationConfig *config,HttpReq req,HttpReq *store)

{
  undefined8 local_58;
  char *reqname [6];
  HttpReq *store_local;
  HttpReq req_local;
  OperationConfig *config_local;
  
  reqname[5] = (char *)store;
  memcpy(&local_58,&DAT_0014f2f0,0x30);
  if ((*(int *)reqname[5] == 0) || (*(HttpReq *)reqname[5] == req)) {
    *(HttpReq *)reqname[5] = req;
    config_local._4_4_ = 0;
  }
  else {
    warnf(config->global,
          "You can only select one HTTP request method! You asked for both %s and %s.",
          reqname[(ulong)req - 1],reqname[(ulong)*(uint *)reqname[5] - 1]);
    config_local._4_4_ = 1;
  }
  return config_local._4_4_;
}

Assistant:

int SetHTTPrequest(struct OperationConfig *config, HttpReq req, HttpReq *store)
{
  /* this mirrors the HttpReq enum in tool_sdecls.h */
  const char *reqname[]= {
    "", /* unspec */
    "GET (-G, --get)",
    "HEAD (-I, --head)",
    "multipart formpost (-F, --form)",
    "POST (-d, --data)",
    "PUT (-T, --upload-file)"
  };

  if((*store == TOOL_HTTPREQ_UNSPEC) ||
     (*store == req)) {
    *store = req;
    return 0;
  }
  warnf(config->global, "You can only select one HTTP request method! "
        "You asked for both %s and %s.",
        reqname[req], reqname[*store]);

  return 1;
}